

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::convert(mip_level *this,conversion_type conv_type)

{
  bool bVar1;
  component_flags cVar2;
  pixel_format pVar3;
  conversion_type conv_type_local;
  mip_level *this_local;
  
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    unpack_from_dxt(this,true);
  }
  image_utils::convert_image(this->m_pImage,conv_type);
  cVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(this->m_pImage);
  this->m_comp_flags = cVar2;
  bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale(this->m_pImage);
  if (bVar1) {
    bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha(this->m_pImage);
    pVar3 = PIXEL_FMT_L8;
    if (bVar1) {
      pVar3 = PIXEL_FMT_A8L8;
    }
    this->m_format = pVar3;
  }
  else {
    bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha(this->m_pImage);
    pVar3 = PIXEL_FMT_R8G8B8;
    if (bVar1) {
      pVar3 = PIXEL_FMT_A8R8G8B8;
    }
    this->m_format = pVar3;
  }
  return true;
}

Assistant:

bool mip_level::convert(image_utils::conversion_type conv_type) {
  if (m_pDXTImage)
    unpack_from_dxt(true);

  image_utils::convert_image(*m_pImage, conv_type);

  m_comp_flags = m_pImage->get_comp_flags();

  if (m_pImage->is_grayscale())
    m_format = m_pImage->has_alpha() ? PIXEL_FMT_A8L8 : PIXEL_FMT_L8;
  else
    m_format = m_pImage->has_alpha() ? PIXEL_FMT_A8R8G8B8 : PIXEL_FMT_R8G8B8;

  return true;
}